

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf,size_t body_size)

{
  int iVar1;
  uint8_t *puVar2;
  size_t __n;
  size_t sVar3;
  uint8_t sizebuf [8];
  uint8_t local_30 [8];
  
  puVar2 = ptls_encode_quicint(local_30,body_size);
  __n = (long)puVar2 - (long)local_30;
  if (__n == 1) {
    sVar3 = buf->off;
  }
  else {
    iVar1 = ptls_buffer_reserve(buf,__n - 1);
    if (iVar1 != 0) {
      return iVar1;
    }
    memmove(buf->base + (buf->off - body_size) + (__n - 1),buf->base + (buf->off - body_size),
            body_size);
    sVar3 = (__n - 1) + buf->off;
    buf->off = sVar3;
  }
  memcpy(buf->base + ((sVar3 - body_size) - __n),local_30,__n);
  return 0;
}

Assistant:

int ptls_buffer__adjust_quic_blocksize(ptls_buffer_t *buf, size_t body_size)
{
    uint8_t sizebuf[PTLS_ENCODE_QUICINT_CAPACITY];
    size_t sizelen = ptls_encode_quicint(sizebuf, body_size) - sizebuf;

    /* adjust amount of space before body_size to `sizelen` bytes */
    if (sizelen != 1) {
        int ret;
        if ((ret = ptls_buffer_reserve(buf, sizelen - 1)) != 0)
            return ret;
        memmove(buf->base + buf->off - body_size - 1 + sizelen, buf->base + buf->off - body_size, body_size);
        buf->off += sizelen - 1;
    }

    /* write the size */
    memcpy(buf->base + buf->off - body_size - sizelen, sizebuf, sizelen);

    return 0;
}